

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Population.cpp
# Opt level: O2

void __thiscall Population::Population(Population *this,World *w,size_t creatno,size_t els)

{
  Creature *this_00;
  type pCVar1;
  bool bVar2;
  undefined1 local_50 [8];
  shared_ptr<Creature> nc;
  
  this->_vptr_Population = (_func_int **)&PTR__Population_001215c0;
  this->ELITE_SIZE = els;
  this->world = w;
  (this->creats).
  super__Vector_base<boost::shared_ptr<Creature>,_std::allocator<boost::shared_ptr<Creature>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->creats).
  super__Vector_base<boost::shared_ptr<Creature>,_std::allocator<boost::shared_ptr<Creature>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->creats).
  super__Vector_base<boost::shared_ptr<Creature>,_std::allocator<boost::shared_ptr<Creature>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->fitdict).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->fitdict).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->fitdict).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  while (bVar2 = creatno != 0, creatno = creatno - 1, bVar2) {
    this_00 = (Creature *)operator_new(0x50);
    Creature::Creature(this_00,this,1);
    boost::shared_ptr<Creature>::shared_ptr<Creature>((shared_ptr<Creature> *)local_50,this_00);
    std::vector<boost::shared_ptr<Creature>,_std::allocator<boost::shared_ptr<Creature>_>_>::
    push_back(&this->creats,(shared_ptr<Creature> *)local_50);
    pCVar1 = boost::shared_ptr<Creature>::operator->((shared_ptr<Creature> *)local_50);
    nc.pn.pi_ = (sp_counted_base *)pCVar1->fitness;
    std::vector<double,_std::allocator<double>_>::emplace_back<double>
              (&this->fitdict,(double *)&nc.pn);
    boost::detail::shared_count::~shared_count((shared_count *)&nc);
  }
  return;
}

Assistant:

Population::Population( World * w, size_t creatno, size_t els ) :
	ELITE_SIZE(els), world(w)
{
	for(size_t i = 0; i < creatno; ++i)
	{
		boost::shared_ptr<Creature> nc(new Creature(this));
		creats.push_back(nc);
		fitdict.push_back(nc->get_fitness());

	}
}